

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_utils.c
# Opt level: O0

int WebPSetWorkerInterface(WebPWorkerInterface *winterface)

{
  long *in_RDI;
  int local_4;
  
  if ((((in_RDI == (long *)0x0) || (*in_RDI == 0)) || (in_RDI[1] == 0)) ||
     (((in_RDI[2] == 0 || (in_RDI[3] == 0)) || ((in_RDI[4] == 0 || (in_RDI[5] == 0)))))) {
    local_4 = 0;
  }
  else {
    memcpy(&g_worker_interface,in_RDI,0x30);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int WebPSetWorkerInterface(const WebPWorkerInterface* const winterface) {
  if (winterface == NULL ||
      winterface->Init == NULL || winterface->Reset == NULL ||
      winterface->Sync == NULL || winterface->Launch == NULL ||
      winterface->Execute == NULL || winterface->End == NULL) {
    return 0;
  }
  g_worker_interface = *winterface;
  return 1;
}